

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::UnCamelCaseFieldName
                   (string *__return_storage_ptr__,string *name,FieldDescriptor *field)

{
  bool bVar1;
  char cVar2;
  Type TVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  bool local_16a;
  int local_138;
  char c;
  int i;
  allocator<char> local_129;
  string local_128;
  string local_108;
  byte local_e3;
  byte local_e2;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string worker;
  FieldDescriptor *field_local;
  string *name_local;
  string *result;
  
  worker.field_2._8_8_ = field;
  std::__cxx11::string::string((string *)local_40,(string *)name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"_p",&local_61);
  bVar1 = HasSuffixString((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"_p",&local_b9);
    StripSuffixString(&local_98,(string *)local_40,&local_b8);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  local_e2 = 0;
  local_e3 = 0;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)worker.field_2._8_8_);
  local_16a = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Array",&local_e1);
    local_e3 = 1;
    local_16a = HasSuffixString((string *)local_40,&local_e0);
  }
  if ((local_e3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_e1);
  }
  if (local_16a != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"Array",&local_129);
    StripSuffixString(&local_108,(string *)local_40,&local_128);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  TVar3 = FieldDescriptor::type((FieldDescriptor *)worker.field_2._8_8_);
  if (TVar3 == TYPE_GROUP) {
    lVar4 = std::__cxx11::string::length();
    if (lVar4 != 0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      bVar1 = ascii_islower(*pcVar5);
      if (bVar1) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        cVar2 = ascii_toupper(*pcVar5);
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        *pcVar5 = cVar2;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    for (local_138 = 0; uVar6 = std::__cxx11::string::size(), (ulong)(long)local_138 < uVar6;
        local_138 = local_138 + 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      cVar2 = *pcVar5;
      bVar1 = ascii_isupper(cVar2);
      if (bVar1) {
        if (0 < local_138) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
        }
        cVar2 = ascii_tolower(cVar2);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string UnCamelCaseFieldName(const string& name, const FieldDescriptor* field) {
  string worker(name);
  if (HasSuffixString(worker, "_p")) {
    worker = StripSuffixString(worker, "_p");
  }
  if (field->is_repeated() && HasSuffixString(worker, "Array")) {
    worker = StripSuffixString(worker, "Array");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    if (worker.length() > 0) {
      if (ascii_islower(worker[0])) {
        worker[0] = ascii_toupper(worker[0]);
      }
    }
    return worker;
  } else {
    string result;
    for (int i = 0; i < worker.size(); i++) {
      char c = worker[i];
      if (ascii_isupper(c)) {
        if (i > 0) {
          result += '_';
        }
        result += ascii_tolower(c);
      } else {
        result += c;
      }
    }
    return result;
  }
}